

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_test.cpp
# Opt level: O3

void operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
               (rt_expr<viennamath::rt_expression_interface<double>_> *e,
               rt_expr<viennamath::rt_expression_interface<double>_> *t,
               rt_constant<long,_viennamath::rt_expression_interface<double>_> *u)

{
  numeric_type t2;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_38;
  ct_vector_3<int,_int,_int> local_2c;
  
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_38,t);
  local_2c.t0_ = 4;
  local_2c.t1_ = 6;
  local_2c.t2_ = 8;
  t2 = viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator()
                 ((rt_expr<viennamath::rt_expression_interface<double>> *)&local_38,&local_2c);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
            (e,t,u,t2,(double)u->s);
  if (local_38._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_38._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  return;
}

Assistant:

void operations_test(E & e, T const & t, U const & u)
{
  operations_test(e, t, u, viennamath::eval(t, viennamath::make_vector(4, 6, 8)),
                           viennamath::eval(u, viennamath::make_vector(4, 6, 8)) );
}